

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synapse.cxx
# Opt level: O0

string * __thiscall
SimpleSynapse::getParameter(string *__return_storage_ptr__,SimpleSynapse *this,string *name)

{
  bool bVar1;
  stringstream local_1a8 [8];
  stringstream param;
  undefined1 local_198 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *name_local;
  SimpleSynapse *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (SimpleSynapse *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = std::operator==(local_20,"time-constant");
  if (bVar1) {
    std::ostream::operator<<(local_198,this->simpleTimeConstant);
  }
  else {
    bVar1 = std::operator==(local_20,"peak-conductance");
    if (!bVar1) {
      Synapse::getParameter(__return_storage_ptr__,&this->super_Synapse,local_20);
      goto LAB_00173451;
    }
    std::ostream::operator<<(local_198,this->simplePeakCnd);
  }
  std::__cxx11::stringstream::str();
LAB_00173451:
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string SimpleSynapse::getParameter( const string& name ) const
{
	stringstream param;
	if (name == "time-constant")
		param << simpleTimeConstant;
	else if (name == "peak-conductance")
		param << simplePeakCnd;
	else
		return Synapse::getParameter(name);
	
	return param.str();
}